

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

void amqp_messenger_destroy_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  void *value_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (value == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_destroy_option",0x3e1,1,"invalid argument (name=%p, value=%p)",name
                ,value);
    }
  }
  else {
    iVar1 = strcmp(MESSENGER_SAVED_MQ_OPTIONS,name);
    if (iVar1 == 0) {
      OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"amqp_messenger_destroy_option",0x3e9,1,
                  "invalid argument (option \'%s\' is not suppported)",name);
      }
    }
  }
  return;
}

Assistant:

static void amqp_messenger_destroy_option(const char* name, const void* value)
{
    if (name == NULL || value == NULL)
    {
        LogError("invalid argument (name=%p, value=%p)", name, value);
    }
    else if (strcmp(MESSENGER_SAVED_MQ_OPTIONS, name) == 0)
    {
        OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
    }
    else
    {
        LogError("invalid argument (option '%s' is not suppported)", name);
    }
}